

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_ManSimPatSimAnd(Gia_Man_t *p,int i,Gia_Obj_t *pObj,int nWords,Vec_Wrd_t *vSims)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  word *pwVar6;
  int local_7c;
  int w;
  word *pSims2;
  word *pSims1;
  word *pSims0;
  word *pSims;
  word Diff1;
  word Diff0;
  word pComps [2];
  Vec_Wrd_t *vSims_local;
  int nWords_local;
  Gia_Obj_t *pObj_local;
  int i_local;
  Gia_Man_t *p_local;
  
  pComps[0] = 0xffffffffffffffff;
  iVar3 = Gia_ObjFaninC0(pObj);
  uVar1 = pComps[(long)iVar3 + -1];
  iVar3 = Gia_ObjFaninC1(pObj);
  uVar2 = pComps[(long)iVar3 + -1];
  pwVar6 = Vec_WrdArray(vSims);
  iVar3 = Gia_ObjFaninId0(pObj,i);
  iVar4 = Gia_ObjFaninId1(pObj,i);
  iVar5 = Gia_ObjIsXor(pObj);
  if (iVar5 == 0) {
    for (local_7c = 0; local_7c < nWords; local_7c = local_7c + 1) {
      pwVar6[(long)(nWords * i) + (long)local_7c] =
           (pwVar6[(long)(nWords * iVar3) + (long)local_7c] ^ uVar1) &
           (pwVar6[(long)(nWords * iVar4) + (long)local_7c] ^ uVar2);
    }
  }
  else {
    for (local_7c = 0; local_7c < nWords; local_7c = local_7c + 1) {
      pwVar6[(long)(nWords * i) + (long)local_7c] =
           pwVar6[(long)(nWords * iVar3) + (long)local_7c] ^ uVar1 ^
           pwVar6[(long)(nWords * iVar4) + (long)local_7c] ^ uVar2;
    }
  }
  return;
}

Assistant:

static inline void Gia_ManSimPatSimAnd( Gia_Man_t * p, int i, Gia_Obj_t * pObj, int nWords, Vec_Wrd_t * vSims )
{
    word pComps[2] = { 0, ~(word)0 };
    word Diff0 = pComps[Gia_ObjFaninC0(pObj)];
    word Diff1 = pComps[Gia_ObjFaninC1(pObj)];
    word * pSims  = Vec_WrdArray(vSims);
    word * pSims0 = pSims + nWords*Gia_ObjFaninId0(pObj, i);
    word * pSims1 = pSims + nWords*Gia_ObjFaninId1(pObj, i);
    word * pSims2 = pSims + nWords*i; int w;
    if ( Gia_ObjIsXor(pObj) )
        for ( w = 0; w < nWords; w++ )
            pSims2[w] = (pSims0[w] ^ Diff0) ^ (pSims1[w] ^ Diff1);
    else
        for ( w = 0; w < nWords; w++ )
            pSims2[w] = (pSims0[w] ^ Diff0) & (pSims1[w] ^ Diff1);
}